

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::endStep(Solver *this,uint32 top,SolverParams *params)

{
  uint uVar1;
  Literal p;
  Solver *this_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  PostPropagator *pPVar5;
  uint uVar6;
  ulong uVar7;
  ReduceStrategy local_34;
  
  this->field_0x207 = this->field_0x207 & 0x7f;
  bVar2 = popRootLevel(this,(this->levels_).root,(LitVec *)0x0,true);
  if (bVar2) {
    popAuxVar(this,0xffffffff,(ConstraintDB *)0x0);
    uVar4 = (this->shared_->step_).rep_;
    uVar6 = *(uint *)&this->field_0x204;
    pPVar5 = PropagatorList::find(&this->post_,0x3ff);
    if (pPVar5 != (PostPropagator *)0x0) {
      (*(pPVar5->super_Constraint)._vptr_Constraint[5])(pPVar5,this,1);
    }
    if (((((*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar4 & 0xfffffffc)) & 3) !=
           0) || (bVar3 = force(this,(Literal)(uVar4 & 0xfffffffe ^ 2)), bVar3)) &&
        (bVar3 = simplify(this), bVar3)) &&
       ((*(this->shared_->solvers_).ebo_.buf != this &&
        (bVar3 = SharedContext::ok(this->shared_), bVar3)))) {
      this_00 = *(this->shared_->solvers_).ebo_.buf;
      uVar1 = (this->assign_).trail.ebo_.size;
      uVar6 = uVar6 & 0x3fffffff;
      uVar7 = (ulong)uVar6;
      if (top < uVar6) {
        uVar7 = (ulong)top;
      }
      while ((uVar7 < uVar1 &&
             ((p.rep_ = (this->assign_).trail.ebo_.buf[uVar7].rep_, p.rep_ >> 2 == uVar4 >> 2 ||
              (bVar3 = force(this_00,p), bVar3))))) {
        uVar7 = uVar7 + 1;
      }
    }
    uVar4 = *(uint *)&params->field_0x18;
    if ((uVar4 >> 0x18 & 1) != 0) {
      local_34 = (ReduceStrategy)0x25800;
      reduceLearnts(this,1.0,&local_34);
      uVar4 = *(uint *)&params->field_0x18;
    }
    if ((uVar4 >> 0x15 & 1) != 0) {
      resetHeuristic(this,this,(DecisionHeuristic *)0x0,Acquire);
      uVar4 = *(uint *)&params->field_0x18;
    }
    if ((uVar4 >> 0x16 & 1) != 0) {
      Assignment::resetPrefs(&this->assign_);
      uVar4 = *(uint *)&params->field_0x18;
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      resetLearntActivities(this);
    }
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool Solver::endStep(uint32 top, const SolverParams& params) {
	initPost_ = 0; // defer calls to PostPropagator::init()
	if (!popRootLevel(rootLevel())) { return false; }
	popAuxVar();
	Literal x = shared_->stepLiteral();
	top = std::min(top, (uint32)lastSimp_);
	if (PostPropagator* pp = getPost(PostPropagator::priority_reserved_look)) {
		pp->destroy(this, true);
	}
	if ((value(x.var()) != value_free || force(~x)) && simplify() && this != shared_->master() && shared_->ok()) {
		Solver& m = *shared_->master();
		for (uint32 end = (uint32)assign_.trail.size(); top < end; ++top) {
			Literal u = assign_.trail[top];
			if (u.var() != x.var() && !m.force(u)) { break; }
		}
	}
	if (params.forgetLearnts())   { reduceLearnts(1.0f); }
	if (params.forgetHeuristic()) { resetHeuristic(this); }
	if (params.forgetSigns())     { resetPrefs(); }
	if (params.forgetActivities()){ resetLearntActivities(); }
	return true;
}